

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void jsonenc_putbytes(jsonenc *e,void *data,size_t len)

{
  ulong __n;
  size_t have;
  size_t len_local;
  void *data_local;
  jsonenc *e_local;
  
  __n = (long)e->end - (long)e->ptr;
  if (__n < len) {
    if (__n != 0) {
      memcpy(e->ptr,data,__n);
      e->ptr = e->ptr + __n;
    }
    e->overflow = (len - __n) + e->overflow;
  }
  else {
    memcpy(e->ptr,data,len);
    e->ptr = e->ptr + len;
  }
  return;
}

Assistant:

static void jsonenc_putbytes(jsonenc* e, const void* data, size_t len) {
  size_t have = e->end - e->ptr;
  if (UPB_LIKELY(have >= len)) {
    memcpy(e->ptr, data, len);
    e->ptr += len;
  } else {
    if (have) {
      memcpy(e->ptr, data, have);
      e->ptr += have;
    }
    e->overflow += (len - have);
  }
}